

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O0

void __thiscall spatial_region::~spatial_region(spatial_region *this)

{
  undefined8 *puVar1;
  long in_RDI;
  void *pv;
  pwpa *a_1;
  pwpo *a;
  field3d<cellb> *in_stack_ffffffffffffffd0;
  vector<field3d<double>,_std::allocator<field3d<double>_>_> *this_00;
  
  while (*(long *)(in_RDI + 0x160) != 0) {
    in_stack_ffffffffffffffd0 = *(field3d<cellb> **)(in_RDI + 0x160);
    *(undefined8 *)(in_RDI + 0x160) = *(undefined8 *)(*(long *)(in_RDI + 0x160) + 8);
    free(*(void **)in_stack_ffffffffffffffd0);
    if (in_stack_ffffffffffffffd0 != (field3d<cellb> *)0x0) {
      operator_delete(in_stack_ffffffffffffffd0);
    }
  }
  while (*(long *)(in_RDI + 0x158) != 0) {
    puVar1 = *(undefined8 **)(in_RDI + 0x158);
    *(undefined8 *)(in_RDI + 0x158) = *(undefined8 *)(*(long *)(in_RDI + 0x158) + 8);
    free((void *)*puVar1);
    if (puVar1 != (undefined8 *)0x0) {
      operator_delete(puVar1);
    }
  }
  free(*(void **)(in_RDI + 0x48));
  free(*(void **)(in_RDI + 0x100));
  free(*(void **)(in_RDI + 0x120));
  this_00 = *(vector<field3d<double>,_std::allocator<field3d<double>_>_> **)(in_RDI + 0xd8);
  free(this_00);
  std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>::
  ~vector((vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
           *)this_00);
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::~vector(this_00);
  field3d<cellp>::~field3d((field3d<cellp> *)in_stack_ffffffffffffffd0);
  field3d<cellbe>::~field3d((field3d<cellbe> *)in_stack_ffffffffffffffd0);
  field3d<cellj>::~field3d((field3d<cellj> *)in_stack_ffffffffffffffd0);
  field3d<cellb>::~field3d(in_stack_ffffffffffffffd0);
  field3d<celle>::~field3d((field3d<celle> *)in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string((string *)(in_RDI + 0x128));
  std::function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)>::~function
            ((function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)> *)0x133aeb);
  std::unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_>::~unique_ptr
            ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
             in_stack_ffffffffffffffd0);
  return;
}

Assistant:

spatial_region::~spatial_region()
{
    // erasing of particles
    while (p_lapwpo!=0) {
        pwpo* a;
        a = p_lapwpo;
        p_lapwpo = p_lapwpo->previous;
        free((void*) a->head);
        //free(a->head);
        delete a;
    }
    while (p_lapwpa!=0) {
        pwpa* a;
        a = p_lapwpa;
        p_lapwpa = p_lapwpa->previous;
        free((void*) a->head);
        //free(a->head);
        delete a;
    }

    void* pv;

    pv = (void*) random;
    free(pv);

    pv = (void*) ienergy;
    free(pv);
    pv = (void*) ienergy_deleted;
    free(pv);

    pv = (void*) N_qp_i;
    free(pv);
}